

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,std::__cxx11::string>
          (ExtensionSet *this,char *ptr,MessageLite *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  byte bVar1;
  ushort *p_00;
  size_t sVar2;
  bool bVar3;
  MessageLite *this_00;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  uint uVar8;
  int field_number;
  ulong uVar9;
  ushort *p_01;
  ExtensionInfo *extension_00;
  char *p;
  int iVar10;
  string_view flat;
  pair<const_char_*,_unsigned_int> pVar11;
  pair<const_char_*,_int> pVar12;
  string_view val;
  bool was_packed_on_wire;
  string payload;
  string tmp;
  ExtensionInfo extension;
  ushort *local_128;
  bool local_119;
  InternalMetadata *local_118;
  MessageLite *local_110;
  char *local_108;
  size_t local_100;
  char local_f8;
  undefined7 uStack_f7;
  Data *local_e8;
  uint64_t local_e0;
  undefined1 local_d8 [32];
  ZeroCopyInputStream *local_b8;
  char acStack_b0 [40];
  uint32_t local_88;
  int local_84;
  int local_80;
  int local_7c;
  DescriptorPool *local_78;
  MessageFactory *pMStack_70;
  ExtensionInfo local_68;
  
  local_108 = &local_f8;
  local_100 = 0;
  local_f8 = '\0';
  local_e8 = &ctx->data_;
  iVar10 = 0;
  uVar9 = 0;
  local_128 = (ushort *)ptr;
  local_118 = metadata;
  local_110 = extendee;
LAB_004052ae:
  do {
    local_e0 = (uVar9 & 0xffffffff) * 8 + 2;
LAB_004052bd:
    do {
      bVar3 = EpsCopyInputStream::DoneWithCheck<false>
                        (&ctx->super_EpsCopyInputStream,(char **)&local_128,ctx->group_depth_);
      p_00 = local_128;
      p_01 = local_128;
      if (bVar3) goto LAB_0040563e;
      p_01 = (ushort *)((long)local_128 + 1);
      bVar1 = (byte)*local_128;
      uVar8 = (uint)bVar1;
      if (bVar1 != 0x10) {
        if (bVar1 == 0x1a) {
          if (iVar10 != 1) {
            local_d8._0_8_ = local_d8 + 0x10;
            local_d8._8_8_ = (char *)0x0;
            local_d8[0x10] = '\0';
            bVar1 = *(byte *)p_01;
            uVar8 = (uint)bVar1;
            if ((char)bVar1 < '\0') {
              local_128 = p_01;
              pVar12 = ReadSizeFallback((char *)p_01,(uint)bVar1);
              uVar8 = pVar12.second;
              local_128 = (ushort *)pVar12.first;
              if (local_128 != (ushort *)0x0) goto LAB_0040541b;
LAB_00405450:
              bVar3 = false;
            }
            else {
              local_128 = local_128 + 1;
LAB_0040541b:
              local_128 = (ushort *)
                          EpsCopyInputStream::ReadString
                                    (&ctx->super_EpsCopyInputStream,(char *)local_128,uVar8,
                                     (string *)local_d8);
              if (local_128 == (ushort *)0x0) goto LAB_00405450;
              bVar3 = true;
              if (iVar10 == 0) {
                std::__cxx11::string::operator=((string *)&local_108,(string *)local_d8);
                iVar10 = 2;
              }
            }
            if ((MessageLite *)local_d8._0_8_ != (MessageLite *)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
            }
            if (!bVar3) goto LAB_0040563b;
            goto LAB_004052bd;
          }
          local_128 = p_01;
          local_128 = (ushort *)ParseField(this,local_e0,(char *)p_01,local_110,local_118,ctx);
          iVar10 = 3;
        }
        else {
          if ((char)bVar1 < '\0') {
            uVar8 = ((uint)bVar1 + (uint)*(byte *)p_01 * 0x80) - 0x80;
            if ((char)*(byte *)p_01 < '\0') {
              local_128 = p_01;
              pVar11 = ReadTagFallback((char *)p_00,uVar8);
              uVar8 = pVar11.second;
              p_01 = (ushort *)pVar11.first;
            }
            else {
              p_01 = local_128 + 1;
            }
          }
          local_128 = p_01;
          if ((uVar8 == 0) || ((uVar8 & 7) == 4)) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar8 - 1;
            goto LAB_0040563e;
          }
          local_128 = (ushort *)ParseField(this,(ulong)uVar8,(char *)p_01,local_110,local_118,ctx);
        }
        if (local_128 == (ushort *)0x0) goto LAB_0040563b;
        goto LAB_004052bd;
      }
      uVar5 = (uint)(char)*p_01;
      uVar8 = (*p_01 & uVar5) + uVar5;
      uVar9 = (ulong)(uVar8 >> 1);
      if ((short)uVar8 < 0) {
        uVar9 = (ulong)(uVar8 >> 1);
        p_01 = (ushort *)((long)local_128 + 3);
        lVar6 = 0xd;
        while( true ) {
          uVar5 = (uint)(char)*p_01;
          uVar8 = (*p_01 & uVar5) + uVar5;
          uVar9 = ((ulong)uVar8 - 2 << ((byte)lVar6 & 0x3f)) + uVar9;
          if (-1 < (short)uVar8) break;
          lVar6 = lVar6 + 0xe;
          p_01 = p_01 + 1;
          if (lVar6 == 0x45) {
            local_128 = (ushort *)0x0;
            goto LAB_0040563b;
          }
        }
        bVar3 = uVar8 < uVar5;
      }
      else {
        bVar3 = uVar8 < uVar5;
      }
      local_128 = (ushort *)((long)p_01 + (ulong)bVar3 + 1);
      field_number = (int)uVar9;
      if (field_number == 0) goto LAB_0040563b;
      if (iVar10 == 0) {
        iVar10 = 1;
        goto LAB_004052ae;
      }
    } while (iVar10 != 2);
    local_68.descriptor = (FieldDescriptor *)0x0;
    local_68.lazy_eager_verify_func = (LazyEagerVerifyFnType)0x0;
    local_68.field_6.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
    local_68.field_6.enum_validity_check.arg = (void *)0x0;
    local_68.message = (MessageLite *)0x0;
    local_68.number = 0;
    local_68.type = '\0';
    local_68.is_repeated = false;
    local_68.is_packed = false;
    local_68.is_lazy = kUndefined;
    local_d8._0_8_ = local_110;
    extension_00 = &local_68;
    bVar3 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                      (this,2,field_number,(GeneratedExtensionFinder *)local_d8,extension_00,
                       &local_119);
    sVar2 = local_100;
    pcVar4 = local_108;
    if (bVar3) {
      if (local_68.is_repeated == true) {
        this_00 = AddMessage(this,field_number,'\v',local_68.field_6.message_info.prototype,
                             local_68.descriptor);
      }
      else {
        this_00 = MutableMessage(this,field_number,'\v',local_68.field_6.message_info.prototype,
                                 local_68.descriptor);
      }
      acStack_b0[0x18] = '\0';
      acStack_b0[0x19] = '\0';
      acStack_b0[0x1a] = '\0';
      acStack_b0[0x1b] = '\0';
      acStack_b0[0x1c] = '\0';
      acStack_b0[0x1d] = '\0';
      acStack_b0[0x1e] = '\0';
      acStack_b0[0x1f] = '\0';
      acStack_b0[0x20] = '\0';
      acStack_b0[0x21] = '\0';
      acStack_b0[0x22] = '\0';
      acStack_b0[0x23] = '\0';
      acStack_b0[0x24] = '\0';
      acStack_b0[0x25] = '\0';
      acStack_b0[0x26] = '\0';
      acStack_b0[0x27] = '\0';
      acStack_b0[8] = '\0';
      acStack_b0[9] = '\0';
      acStack_b0[10] = '\0';
      acStack_b0[0xb] = '\0';
      acStack_b0[0xc] = '\0';
      acStack_b0[0xd] = '\0';
      acStack_b0[0xe] = '\0';
      acStack_b0[0xf] = '\0';
      acStack_b0[0x10] = '\0';
      acStack_b0[0x11] = '\0';
      acStack_b0[0x12] = '\0';
      acStack_b0[0x13] = '\0';
      acStack_b0[0x14] = '\0';
      acStack_b0[0x15] = '\0';
      acStack_b0[0x16] = '\0';
      acStack_b0[0x17] = '\0';
      local_b8 = (ZeroCopyInputStream *)0x0;
      acStack_b0[0] = '\0';
      acStack_b0[1] = '\0';
      acStack_b0[2] = '\0';
      acStack_b0[3] = '\0';
      acStack_b0[4] = '\0';
      acStack_b0[5] = '\0';
      acStack_b0[6] = '\0';
      acStack_b0[7] = '\0';
      local_88 = 0;
      local_84 = 0x7fffffff;
      local_80 = ctx->depth_;
      local_7c = -0x80000000;
      local_78 = local_e8->pool;
      pMStack_70 = local_e8->factory;
      flat._M_str = local_108;
      flat._M_len = local_100;
      pcVar4 = EpsCopyInputStream::InitFrom((EpsCopyInputStream *)local_d8,flat);
      pcVar4 = MessageLite::_InternalParse(this_00,pcVar4,(ParseContext *)local_d8);
      if ((pcVar4 == (char *)0x0) || (iVar10 = 3, local_88 != 0)) {
LAB_0040563b:
        p_01 = (ushort *)0x0;
LAB_0040563e:
        if (local_108 != &local_f8) {
          operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
        }
        return (char *)p_01;
      }
    }
    else {
      if ((local_118->ptr_ & 1U) == 0) {
        pbVar7 = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>(local_118);
      }
      else {
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((local_118->ptr_ & 0xfffffffffffffffeU) + 8);
      }
      val._M_str = (char *)pbVar7;
      val._M_len = (size_t)pcVar4;
      WriteLengthDelimited
                ((internal *)(uVar9 & 0xffffffff),(uint32_t)sVar2,val,(string *)extension_00);
      iVar10 = 3;
    }
  } while( true );
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(
    const char* ptr, const Msg* extendee, internal::InternalMetadata* metadata,
    internal::ParseContext* ctx) {
  std::string payload;
  uint32_t type_id = 0;
  enum class State { kNoTag, kHasType, kHasPayload, kDone };
  State state = State::kNoTag;

  while (!ctx->Done(&ptr)) {
    uint32_t tag = static_cast<uint8_t>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64_t tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      // We should fail parsing if type id is 0 after cast to uint32.
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr &&
                                     static_cast<uint32_t>(tmp) != 0);
      if (state == State::kNoTag) {
        type_id = static_cast<uint32_t>(tmp);
        state = State::kHasType;
      } else if (state == State::kHasPayload) {
        type_id = static_cast<uint32_t>(tmp);
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, extendee, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields<T>());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools. Spawn a new
          // ParseContext inheriting those attributes.
          ParseContext tmp_ctx(ParseContext::kSpawn, *ctx, &p, payload);
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        state = State::kDone;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (state == State::kHasType) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64_t>(type_id) * 8 + 2, ptr,
                                    extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        state = State::kDone;
      } else {
        std::string tmp;
        int32_t size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &tmp);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        if (state == State::kNoTag) {
          payload = std::move(tmp);
          state = State::kHasPayload;
        }
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, extendee, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}